

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Buffer::Buffer(Buffer *this)

{
  Buffer *local_28;
  value_type_conflict local_20 [2];
  int i;
  Buffer *local_10;
  Buffer *this_local;
  
  local_28 = this;
  local_10 = this;
  do {
    Block::Block(local_28->buffer);
    local_28 = (Buffer *)(local_28->buffer + 1);
  } while (local_28 != (Buffer *)&this->Empty_Block);
  std::__cxx11::list<int,_std::allocator<int>_>::list(&this->Empty_Block);
  std::__cxx11::list<int,_std::allocator<int>_>::list(&this->Occupy_Block);
  for (local_20[0] = 0; local_20[0] < 0x1400; local_20[0] = local_20[0] + 1) {
    std::__cxx11::list<int,_std::allocator<int>_>::push_back(&this->Empty_Block,local_20);
    UnDirt(this,local_20[0]);
    UnLock(this,local_20[0]);
  }
  std::__cxx11::list<int,_std::allocator<int>_>::clear(&this->Occupy_Block);
  return;
}

Assistant:

Buffer::Buffer(void){
	int i;
	for (i = 0; i < MAX_BLOCKS; i++) {
		this->Empty_Block.push_back(i);
		this->UnDirt(i);
		this->UnLock(i);
	}
	this->Occupy_Block.clear();
}